

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

ImGuiID __thiscall ImGuiWindow::GetIDNoKeepAlive(ImGuiWindow *this,void *ptr)

{
  uint uVar1;
  long lVar2;
  void *local_8;
  
  local_8 = ptr;
  lVar2 = (long)(this->IDStack).Size;
  if (0 < lVar2) {
    uVar1 = ~(this->IDStack).Data[lVar2 + -1];
    lVar2 = 0;
    do {
      uVar1 = uVar1 >> 8 ^ GCrc32LookupTable[(uint)*(byte *)((long)&local_8 + lVar2) ^ uVar1 & 0xff]
      ;
      lVar2 = lVar2 + 1;
    } while (lVar2 != 8);
    return ~uVar1;
  }
  __assert_fail("Size > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/jdupuy[P]LongestEdgeBisectionDemos/submodules/imgui/imgui.h"
                ,0x4f0,"T &ImVector<unsigned int>::back() [T = unsigned int]");
}

Assistant:

ImGuiID ImGuiWindow::GetIDNoKeepAlive(const void* ptr)
{
    ImGuiID seed = IDStack.back();
    return ImHashData(&ptr, sizeof(void*), seed);
}